

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::
~FeatureSetDefaults_FeatureSetEditionDefault(FeatureSetDefaults_FeatureSetEditionDefault *this)

{
  FeatureSetDefaults_FeatureSetEditionDefault *this_local;
  
  SharedDtor((MessageLite *)this);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

FeatureSetDefaults_FeatureSetEditionDefault::~FeatureSetDefaults_FeatureSetEditionDefault() {
  // @@protoc_insertion_point(destructor:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  SharedDtor(*this);
}